

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

void __thiscall Clasp::mt::ParallelSolve::SharedData::clearQueue(SharedData *this)

{
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ppVar1;
  pointer pLVar2;
  uint uVar3;
  
  uVar3 = (this->workQ).qFront;
  if (uVar3 != (this->workQ).vec.ebo_.size) {
    do {
      (this->workQ).qFront = uVar3 + 1;
      ppVar1 = (this->workQ).vec.ebo_.buf[uVar3];
      if (ppVar1 != (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0) {
        pLVar2 = (ppVar1->ebo_).buf;
        if (pLVar2 != (pointer)0x0) {
          operator_delete(pLVar2);
        }
        operator_delete(ppVar1);
      }
      uVar3 = (this->workQ).qFront;
    } while (uVar3 != (this->workQ).vec.ebo_.size);
  }
  (this->workQ).vec.ebo_.size = 0;
  (this->workQ).qFront = 0;
  return;
}

Assistant:

void clearQueue() {
		while (!workQ.empty()) { delete workQ.pop_ret(); }
		workQ.clear();
	}